

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

PropertyString * __thiscall
Js::LiteralStringWithPropertyStringPtr::GetOrAddPropertyString
          (LiteralStringWithPropertyStringPtr *this)

{
  PropertyId propertyId;
  PropertyString **ppPVar1;
  ScriptContext *this_00;
  PropertyString *ptr;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  LiteralStringWithPropertyStringPtr *this_local;
  
  propertyRecord = (PropertyRecord *)this;
  ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                      ((WriteBarrierPtr *)&this->propertyString);
  if (*ppPVar1 == (PropertyString *)0x0) {
    local_20 = (PropertyRecord *)0x0;
    GetPropertyRecordImpl(this,&local_20,false);
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    propertyId = PropertyRecord::GetPropertyId(local_20);
    ptr = ScriptContext::GetPropertyString(this_00,propertyId);
    Memory::WriteBarrierPtr<Js::PropertyString>::operator=(&this->propertyString,ptr);
    ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                        ((WriteBarrierPtr *)&this->propertyString);
    this_local = (LiteralStringWithPropertyStringPtr *)*ppPVar1;
  }
  else {
    ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                        ((WriteBarrierPtr *)&this->propertyString);
    this_local = (LiteralStringWithPropertyStringPtr *)*ppPVar1;
  }
  return (PropertyString *)this_local;
}

Assistant:

PropertyString * LiteralStringWithPropertyStringPtr::GetOrAddPropertyString()
    {
        if (this->propertyString != nullptr)
        {
            return this->propertyString;
        }

        Js::PropertyRecord const * propertyRecord = nullptr;
        GetPropertyRecordImpl(&propertyRecord);

        this->propertyString = this->GetScriptContext()->GetPropertyString(propertyRecord->GetPropertyId());
        return this->propertyString;
    }